

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_705::expandHrp
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,string *hrp
          )

{
  byte bVar1;
  long lVar2;
  byte *pbVar3;
  reference pvVar4;
  ulong uStack_40;
  uchar c;
  size_type i;
  allocator<unsigned_char> local_22;
  undefined1 local_21;
  ulong local_20;
  size_type sz;
  string *hrp_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  
  sz = (size_type)hrp;
  hrp_local = (string *)__return_storage_ptr__;
  local_20 = std::__cxx11::string::size();
  local_21 = 0;
  lVar2 = local_20 * 2;
  std::allocator<unsigned_char>::allocator(&local_22);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,lVar2 + 1,&local_22);
  std::allocator<unsigned_char>::~allocator(&local_22);
  for (uStack_40 = 0; uStack_40 < local_20; uStack_40 = uStack_40 + 1) {
    pbVar3 = (byte *)std::__cxx11::string::operator[](sz);
    bVar1 = *pbVar3;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,uStack_40);
    *pvVar4 = (value_type)((int)(uint)bVar1 >> 5);
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,uStack_40 + local_20 + 1);
    *pbVar3 = bVar1 & 0x1f;
  }
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (__return_storage_ptr__,local_20);
  *pvVar4 = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> expandHrp(const std::string & hrp) {
        std::string::size_type sz = hrp.size();
        std::vector<unsigned char> ret(sz * 2 + 1);
        for(std::string::size_type i=0; i < sz; ++i) {
            auto c = static_cast<unsigned char>(hrp[i]);
            ret[i] = c >> 5u;
            ret[i + sz + 1] = c & static_cast<unsigned char>(0x1f);
        }
        ret[sz] = 0;
        return ret;
    }